

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void load_reg_var(DisasContext_conflict1 *s,TCGv_i32 var,int reg)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t arg;
  TCGContext_conflict1 *tcg_ctx;
  int reg_local;
  TCGv_i32 var_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (reg == 0xf) {
    arg = read_pc(s);
    tcg_gen_movi_i32(tcg_ctx_00,var,arg);
  }
  else {
    tcg_gen_mov_i32(tcg_ctx_00,var,tcg_ctx_00->cpu_R[reg]);
  }
  return;
}

Assistant:

static void load_reg_var(DisasContext *s, TCGv_i32 var, int reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (reg == 15) {
        tcg_gen_movi_i32(tcg_ctx, var, read_pc(s));
    } else {
        tcg_gen_mov_i32(tcg_ctx, var, tcg_ctx->cpu_R[reg]);
    }
}